

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,basic_string_view<char,_std::char_traits<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_6)

{
  string_view data;
  string_view format_00;
  char *local_d0;
  size_t local_c8;
  char local_c0;
  undefined7 uStack_bf;
  Output *local_b0;
  size_t local_a8;
  char *pcStack_a0;
  size_type local_98;
  pointer local_90;
  size_t local_88;
  pointer local_80;
  size_type local_78;
  pointer local_70;
  size_type local_68;
  pointer local_60;
  size_type local_58;
  pointer local_50;
  size_type local_48;
  pointer local_40;
  
  format_00._M_len = format._M_str;
  local_a8 = arg->_M_len;
  pcStack_a0 = arg->_M_str;
  local_90 = (arg_1->_M_dataplus)._M_p;
  local_98 = arg_1->_M_string_length;
  local_80 = (arg_2->_M_dataplus)._M_p;
  local_88 = arg_2->_M_string_length;
  local_70 = (arg_3->_M_dataplus)._M_p;
  local_78 = arg_3->_M_string_length;
  local_60 = (arg_4->_M_dataplus)._M_p;
  local_68 = arg_4->_M_string_length;
  local_50 = (arg_5->_M_dataplus)._M_p;
  local_58 = arg_5->_M_string_length;
  local_40 = (arg_6->_M_dataplus)._M_p;
  local_48 = arg_6->_M_string_length;
  local_c8 = 0;
  local_c0 = '\0';
  format_00._M_str = (char *)&local_a8;
  local_d0 = &local_c0;
  local_b0 = this;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_d0,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x7,local_88);
  data._M_str = local_d0;
  data._M_len = local_c8;
  Write(local_b0,data);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }